

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O2

void mpp_put_bits(BitputCtx_t *bp,RK_U64 invalue,RK_S32 lbits)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (lbits != 0) {
    uVar1 = bp->buflen;
    uVar2 = bp->index;
    uVar5 = (ulong)uVar2;
    if (uVar2 < uVar1) {
      bVar3 = -(char)lbits;
      uVar4 = (invalue << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
      bVar3 = bp->bitpos;
      uVar6 = uVar4 << (bVar3 & 0x3f) | bp->bvalue;
      bp->bvalue = uVar6;
      if (0x3f < (int)((uint)bVar3 + lbits)) {
        bp->pbuf[uVar5] = uVar6;
        uVar6 = uVar4 >> (-bVar3 & 0x3f);
        bp->bvalue = uVar6;
        uVar5 = (ulong)(uVar2 + 1);
        bp->index = uVar2 + 1;
      }
      if ((uint)uVar5 < uVar1) {
        bp->pbuf[uVar5] = uVar6;
        bp->bitpos = (char)lbits + bVar3 & 0x3f;
      }
    }
  }
  return;
}

Assistant:

void mpp_put_bits(BitputCtx_t *bp, RK_U64 invalue, RK_S32 lbits)
{
    RK_U8 hbits = 0;

    if (!lbits) return;

    if (bp->index >= bp->buflen) return;

    hbits = 64 - lbits;
    invalue = (invalue << hbits) >> hbits;
    bp->bvalue |= invalue << bp->bitpos;  // high bits value
    if ((bp->bitpos + lbits) >= 64) {
        bp->pbuf[bp->index] = bp->bvalue;
        bp->bvalue = invalue >> (64 - bp->bitpos);  // low bits value
        bp->index++;
    }

    if (bp->index >= bp->buflen)
        return;

    bp->pbuf[bp->index] = bp->bvalue;
    bp->bitpos = (bp->bitpos + lbits) & 63;
    // mpp_log("bp->index = %d bp->bitpos = %d lbits = %d invalue 0x%x bp->hvalue 0x%x  bp->lvalue 0x%x",bp->index,bp->bitpos,lbits, (RK_U32)invalue,(RK_U32)(bp->bvalue >> 32),(RK_U32)bp->bvalue);
}